

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

void HeavyChange_Test_Hitter<8u>(string *PATH)

{
  size_type *psVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  code *pcVar6;
  Abstract<8U> *this;
  LDSketch_t *pLVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  char cVar10;
  Data<8U> *pDVar11;
  uint uVar12;
  undefined1 auVar13 [64];
  int iVar14;
  value_type *__val;
  void *pvVar15;
  long *plVar16;
  FR<8U> *pFVar17;
  FR_CF<8U> *pFVar18;
  WavingSketch<8U,_1U,_8U> *pWVar19;
  WavingSketch<8U,_16U,_8U> *pWVar20;
  LdSketchWrapper<8U> *pLVar21;
  ostream *poVar22;
  iterator iVar23;
  mapped_type *pmVar24;
  undefined1 (*pauVar25) [16];
  __hashtable_alloc *p_Var26;
  undefined4 uVar27;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  undefined8 *puVar28;
  undefined1 (*pauVar29) [16];
  undefined1 *puVar30;
  uint32_t j;
  uint uVar31;
  long lVar32;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  iterator __end3;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auStack_348 [8];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<8U>,_int>,_true>_>_>
  local_340;
  ofstream out;
  long local_330;
  long lStack_328;
  ios_base local_248 [264];
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140;
  undefined1 *local_108;
  string *local_100;
  __hashtable_alloc *local_f8;
  undefined8 local_f0;
  LdSketchWrapper<8U> *local_e8;
  size_type *local_e0;
  string file;
  int record_count;
  undefined1 (*local_b0) [16];
  undefined1 (*local_a8) [16];
  int local_9c;
  Data<8U> *local_98;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 auStack_58 [8];
  key_type local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 auVar38 [16];
  
  local_78._8_8_ = local_78._0_8_;
  puVar30 = auStack_348;
  local_100 = PATH;
  _record_count = (undefined1 (*) [16])operator_new(0x18);
  local_b0 = (undefined1 (*) [16])(_record_count[1] + 8);
  *_record_count = (undefined1  [16])0x0;
  *(undefined8 *)_record_count[1] = 0;
  local_e0 = &file._M_string_length;
  local_a8 = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"caida","");
  pvVar15 = operator_new(0x200);
  psVar1 = &__str._M_string_length;
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_e0);
  local_88._0_8_ = local_78;
  pauVar25 = (undefined1 (*) [16])(plVar16 + 2);
  if ((undefined1 (*) [16])*plVar16 == pauVar25) {
    local_78 = *pauVar25;
  }
  else {
    local_78._0_8_ = *(long *)*pauVar25;
    local_88._0_8_ = (undefined1 (*) [16])*plVar16;
  }
  local_88._8_8_ = plVar16[1];
  *plVar16 = (long)pauVar25;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_88);
  p_Var26 = (__hashtable_alloc *)(plVar16 + 2);
  if ((__hashtable_alloc *)*plVar16 == p_Var26) {
    local_330 = *(long *)p_Var26;
    lStack_328 = plVar16[3];
    local_340._M_h = (__hashtable_alloc *)&local_330;
  }
  else {
    local_330 = *(long *)p_Var26;
    local_340._M_h = (__hashtable_alloc *)*plVar16;
  }
  _out = plVar16[1];
  *plVar16 = (long)p_Var26;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  std::ofstream::ofstream(pvVar15,(string *)&local_340,_S_out);
  *(void **)*_record_count = pvVar15;
  if (local_340._M_h != (__hashtable_alloc *)&local_330) {
    operator_delete(local_340._M_h,local_330 + 1);
  }
  if ((undefined1 (*) [16])local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)((long)(_Hash_node_base **)local_78._0_8_ + 1));
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  pvVar15 = operator_new(0x200);
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_e0);
  local_88._0_8_ = local_78;
  pauVar25 = (undefined1 (*) [16])(plVar16 + 2);
  if ((undefined1 (*) [16])*plVar16 == pauVar25) {
    local_78 = *pauVar25;
  }
  else {
    local_78._0_8_ = *(long *)*pauVar25;
    local_88._0_8_ = (undefined1 (*) [16])*plVar16;
  }
  local_88._8_8_ = plVar16[1];
  *plVar16 = (long)pauVar25;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_88);
  p_Var26 = (__hashtable_alloc *)(plVar16 + 2);
  if ((__hashtable_alloc *)*plVar16 == p_Var26) {
    local_330 = *(long *)p_Var26;
    lStack_328 = plVar16[3];
    local_340._M_h = (__hashtable_alloc *)&local_330;
  }
  else {
    local_330 = *(long *)p_Var26;
    local_340._M_h = (__hashtable_alloc *)*plVar16;
  }
  _out = plVar16[1];
  *plVar16 = (long)p_Var26;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  std::ofstream::ofstream(pvVar15,(string *)&local_340,_S_out);
  *(void **)(*_record_count + 8) = pvVar15;
  if (local_340._M_h != (__hashtable_alloc *)&local_330) {
    operator_delete(local_340._M_h,local_330 + 1);
  }
  if ((undefined1 (*) [16])local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)((long)(_Hash_node_base **)local_78._0_8_ + 1));
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  pvVar15 = operator_new(0x200);
  local_50.str = (uchar  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_e0);
  local_88._0_8_ = local_78;
  pauVar25 = (undefined1 (*) [16])(plVar16 + 2);
  if ((undefined1 (*) [16])*plVar16 == pauVar25) {
    local_78 = *pauVar25;
  }
  else {
    local_78._0_8_ = *(long *)*pauVar25;
    local_88._0_8_ = (undefined1 (*) [16])*plVar16;
  }
  local_88._8_8_ = plVar16[1];
  *plVar16 = (long)pauVar25;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_88);
  p_Var26 = (__hashtable_alloc *)(plVar16 + 2);
  if ((__hashtable_alloc *)*plVar16 == p_Var26) {
    local_330 = *(long *)p_Var26;
    lStack_328 = plVar16[3];
    local_340._M_h = (__hashtable_alloc *)&local_330;
  }
  else {
    local_330 = *(long *)p_Var26;
    local_340._M_h = (__hashtable_alloc *)*plVar16;
  }
  _out = plVar16[1];
  *plVar16 = (long)p_Var26;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  std::ofstream::ofstream(pvVar15,(string *)&local_340,_S_out);
  *(void **)_record_count[1] = pvVar15;
  if (local_340._M_h != (__hashtable_alloc *)&local_330) {
    operator_delete(local_340._M_h,local_330 + 1);
  }
  if ((undefined1 (*) [16])local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)((long)(_Hash_node_base **)local_78._0_8_ + 1));
  }
  if (local_50.str != (uchar  [8])psVar1) {
    operator_delete((void *)local_50.str,__str._M_string_length + 1);
  }
  local_f8 = _VTT;
  local_f0 = _log;
  iVar14 = 0;
  do {
    local_90 = (ulong)(iVar14 * 500000 + 2000000);
    local_98 = (Data<8U> *)(local_90 / 1000);
    *(undefined8 *)(puVar30 + -8) = 0x1079dc;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m");
    local_88._0_8_ = auStack_58;
    local_88._8_8_ = 1;
    local_78 = (undefined1  [16])0x0;
    local_68._0_8_ = 0x3f800000;
    stack0xffffffffffffffa0 = (undefined1  [16])0x0;
    puVar28 = (undefined8 *)(puVar30 + -0x50);
    local_108 = puVar30;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a27;
    pFVar17 = (FR<8U> *)operator_new(0x90);
    uVar34 = local_90;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a3e;
    FR<8U>::FR(pFVar17,(int)uVar34,0x6ce);
    *puVar28 = pFVar17;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a4b;
    pFVar18 = (FR_CF<8U> *)operator_new(0x98);
    uVar34 = local_90;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a62;
    FR_CF<8U>::FR_CF(pFVar18,(int)uVar34,0x6ce);
    *(FR_CF<8U> **)(puVar30 + -0x48) = pFVar18;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a70;
    pWVar19 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    uVar12 = (uint)local_90;
    uVar31 = (uint)local_90 / 10;
    *(undefined8 *)(puVar30 + -0x58) = 0x107a9c;
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar19,uVar12 / 10,0x6ce,3);
    *(WavingSketch<8U,_1U,_8U> **)(puVar30 + -0x40) = pWVar19;
    *(undefined8 *)(puVar30 + -0x58) = 0x107aaa;
    pWVar20 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar30 + -0x58) = 0x107ac2;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar20,uVar31,0x6ce,3);
    *(WavingSketch<8U,_16U,_8U> **)(puVar30 + -0x38) = pWVar20;
    *(undefined8 *)(puVar30 + -0x58) = 0x107ad0;
    pLVar21 = (LdSketchWrapper<8U> *)operator_new(0x88);
    uVar31 = uVar12 / 10;
    local_e8 = pLVar21;
    *(undefined8 *)(puVar30 + -0x58) = 0x107aee;
    LdSketchWrapper<8U>::LdSketchWrapper(pLVar21,uVar12 / 10,0x6ce);
    *(LdSketchWrapper<8U> **)(puVar30 + -0x30) = pLVar21;
    *(undefined8 *)(puVar30 + -0x58) = 0x107afc;
    pFVar17 = (FR<8U> *)operator_new(0x90);
    uVar34 = local_90;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b13;
    FR<8U>::FR(pFVar17,(int)uVar34,0x6ce);
    *(FR<8U> **)(puVar30 + -0x28) = pFVar17;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b21;
    pFVar18 = (FR_CF<8U> *)operator_new(0x98);
    uVar34 = local_90;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b38;
    FR_CF<8U>::FR_CF(pFVar18,(int)uVar34,0x6ce);
    *(FR_CF<8U> **)(puVar30 + -0x20) = pFVar18;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b46;
    pWVar19 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar30 + -0x58) = 0x107b5e;
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar19,uVar31,0x6ce,3);
    *(WavingSketch<8U,_1U,_8U> **)(puVar30 + -0x18) = pWVar19;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b6c;
    pWVar20 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    *(undefined8 *)(puVar30 + -0x58) = 0x107b84;
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar20,uVar31,0x6ce,3);
    *(WavingSketch<8U,_16U,_8U> **)(puVar30 + -0x10) = pWVar20;
    *(undefined8 *)(puVar30 + -0x58) = 0x107b92;
    pLVar21 = (LdSketchWrapper<8U> *)operator_new(0x88);
    local_9c = iVar14;
    *(undefined8 *)(puVar30 + -0x58) = 0x107bac;
    LdSketchWrapper<8U>::LdSketchWrapper(pLVar21,uVar31,0x6ce);
    *(LdSketchWrapper<8U> **)(puVar30 + -8) = pLVar21;
    pauVar25 = local_b0;
    pauVar29 = _record_count;
    pauVar35 = local_b0;
    if (local_9c == 0) {
      pauVar33 = _record_count;
      if (_record_count != local_b0) {
        do {
          poVar22 = *(ostream **)*pauVar33;
          *(undefined8 *)(puVar30 + -0x58) = 0x107bec;
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,"MEM(KB)",7);
          *(undefined8 *)(puVar30 + -0x58) = 0x107c00;
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,",",1);
          lVar32 = 0;
          do {
            poVar22 = *(ostream **)*pauVar33;
            pcVar2 = *(char **)(puVar28[lVar32] + 8);
            lVar3 = *(long *)(puVar28[lVar32] + 0x10);
            *(undefined8 *)(puVar30 + -0x58) = 0x107c18;
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>(poVar22,pcVar2,lVar3);
            *(undefined8 *)(puVar30 + -0x58) = 0x107c2c;
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,",",1);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 5);
          uVar4 = *(undefined8 *)(**(long **)*pauVar33 + -0x18);
          cVar10 = (char)*(long **)*pauVar33;
          *(undefined8 *)(puVar30 + -0x58) = 0x107c4e;
          std::ios::widen((char)uVar4 + cVar10);
          *(undefined8 *)(puVar30 + -0x58) = 0x107c59;
          std::ostream::put(cVar10);
          *(undefined8 *)(puVar30 + -0x58) = 0x107c61;
          std::ostream::flush();
          pauVar33 = (undefined1 (*) [16])(*pauVar33 + 8);
          pauVar29 = _record_count;
          pauVar35 = local_b0;
        } while (pauVar33 != pauVar25);
        goto LAB_00107ca6;
      }
    }
    else {
LAB_00107ca6:
      for (; pDVar11 = local_98, pauVar29 != pauVar35;
          pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8)) {
        poVar22 = *(ostream **)*pauVar29;
        *(undefined8 *)(puVar30 + -0x58) = 0x107c8e;
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)pDVar11);
        *(undefined8 *)(puVar30 + -0x58) = 0x107ca2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,",",1);
      }
    }
    pcVar2 = (local_100->_M_dataplus)._M_p;
    *(undefined8 *)(puVar30 + -0x58) = 0x107cc7;
    local_98 = read_standard_data<8u>(pcVar2,record_length,(int *)(file.field_2._M_local_buf + 8));
    local_50.str[0] = '\0';
    local_50.str[1] = '\0';
    local_50.str[2] = '\0';
    local_50.str[3] = '\0';
    local_50.str[4] = '\0';
    local_50.str[5] = '\0';
    local_50.str[6] = '\0';
    local_50.str[7] = '\0';
    uVar27 = (int)file.field_2._8_4_ / 2;
    if (9999999 < (int)file.field_2._8_4_ / 2) {
      uVar27 = 10000000;
    }
    uVar34 = 0;
    if (1 < (int)file.field_2._8_4_) {
      uVar34 = 1;
      if (1 < (int)uVar27) {
        uVar34 = (ulong)(uint)uVar27;
      }
      uVar36 = 0;
      file.field_2._12_4_ = uVar27;
      do {
        local_50.str = *&local_98[uVar36].str;
        *(undefined8 *)(puVar30 + -0x58) = 0x107d28;
        iVar23 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_88,&local_50);
        if (iVar23.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(puVar30 + -0x58) = 0x107d49;
          pmVar24 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_88,&local_50);
          *pmVar24 = 1;
        }
        else {
          *(undefined8 *)(puVar30 + -0x58) = 0x107d39;
          pmVar24 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_88,&local_50);
          *pmVar24 = *pmVar24 + 1;
        }
        uVar36 = uVar36 + 1;
        lVar32 = 0;
        do {
          puVar5 = (undefined8 *)puVar28[lVar32];
          pcVar6 = *(code **)*puVar5;
          *(undefined8 *)(puVar30 + -0x58) = 0x107d61;
          (*pcVar6)(puVar5,&local_50);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 5);
        uVar27 = file.field_2._12_4_;
      } while (uVar36 != uVar34);
    }
    if (SBORROW4((int)uVar34,uVar27 * 2) != (int)uVar34 + uVar27 * -2 < 0) {
      do {
        local_50.str = *&local_98[uVar34].str;
        *(undefined8 *)(puVar30 + -0x58) = 0x107d9d;
        iVar23 = std::
                 _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_88,&local_50);
        if (iVar23.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(puVar30 + -0x58) = 0x107dbe;
          pmVar24 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_88,&local_50);
          *pmVar24 = -1;
        }
        else {
          *(undefined8 *)(puVar30 + -0x58) = 0x107dae;
          pmVar24 = std::__detail::
                    _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_88,&local_50);
          *pmVar24 = *pmVar24 + -1;
        }
        uVar34 = uVar34 + 1;
        lVar32 = 0;
        do {
          puVar5 = *(undefined8 **)(puVar30 + lVar32 * 8 + -0x28);
          pcVar6 = *(code **)*puVar5;
          *(undefined8 *)(puVar30 + -0x58) = 0x107dd7;
          (*pcVar6)(puVar5,&local_50);
          lVar32 = lVar32 + 1;
        } while (lVar32 != 5);
      } while (uVar34 != (uint)(uVar27 * 2));
    }
    pDVar11 = local_98;
    *(undefined8 *)(puVar30 + -0x58) = 0x107df1;
    free(pDVar11);
    lVar32 = -5;
    do {
      plVar16 = *(long **)(puVar30 + lVar32 * 8 + -0x28);
      local_140._M_buckets = (__buckets_ptr)0x0;
      local_140._M_bucket_count = local_88._8_8_;
      local_140._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_140._M_element_count = local_78._8_8_;
      local_140._M_rehash_policy._0_8_ = local_68._0_8_;
      local_140._M_rehash_policy._M_next_resize = local_68._8_8_;
      local_140._M_single_bucket = (__node_base_ptr)0x0;
      local_340._M_h = (__hashtable_alloc *)&local_140;
      *(undefined8 *)(puVar30 + -0x58) = 0x107e5f;
      std::
      _Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<8u>const,int>,true>>>>
                ((_Hashtable<Data<8u>,std::pair<Data<8u>const,int>,std::allocator<std::pair<Data<8u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<8u>>,My_Hash<8u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_140,
                 (_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_88,&local_340);
      uVar4 = *(undefined8 *)(puVar30 + lVar32 * 8);
      pcVar6 = *(code **)(*plVar16 + 0x20);
      *(undefined8 *)(puVar30 + -0x58) = 0x107e78;
      (*pcVar6)(plVar16,&local_140,uVar4,&record_count);
      *(undefined8 *)(puVar30 + -0x58) = 0x107e80;
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_140);
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0);
    *(undefined8 *)(puVar30 + -0x58) = 0x107e95;
    std::ofstream::ofstream(&local_340);
    uVar34 = local_90;
    pLVar21 = local_e8;
    lVar32 = 0;
    do {
      *(undefined8 *)(puVar30 + -0x58) = 0x107eb4;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      this = (Abstract<8U> *)puVar28[lVar32];
      *(undefined8 *)(puVar30 + -0x58) = 0x107ec7;
      Abstract<8U>::print_f1(this,(ofstream *)&local_340,(int)uVar34);
      lVar32 = lVar32 + 1;
    } while (lVar32 != 5);
    pLVar7 = pLVar21->summary;
    iVar14 = pLVar7->w * pLVar7->h;
    if (0 < iVar14) {
      uVar34 = (ulong)(iVar14 + 3U & 0xfffffffc);
      auVar43 = vpbroadcastq_avx512vl();
      uVar36 = 0;
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar45 = auVar13;
        auVar44 = vpbroadcastq_avx512vl();
        auVar44 = vpor_avx2(auVar44,auVar9);
        uVar37 = vpcmpuq_avx512vl(auVar44,auVar43,2);
        uVar37 = uVar37 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(pLVar7->tbl + uVar36));
        auVar38 = vpgatherqd_avx512vl(*(undefined8 *)(uVar34 + 0x40));
        auVar39._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar38._4_4_;
        auVar39._0_4_ = (uint)((byte)uVar37 & 1) * auVar38._0_4_;
        auVar39._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar38._8_4_;
        auVar39._12_4_ = (uint)(byte)(uVar37 >> 3) * auVar38._12_4_;
        auVar38 = vpaddd_avx(auVar39,auVar45._0_16_);
        uVar36 = uVar36 + 4;
        auVar13 = ZEXT1664(auVar38);
      } while (uVar34 != uVar36);
      auVar38 = vmovdqa32_avx512vl(auVar38);
      bVar8 = (bool)((byte)uVar37 & 1);
      auVar40._0_4_ = (uint)bVar8 * auVar38._0_4_ | (uint)!bVar8 * auVar45._0_4_;
      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar45._4_4_;
      bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar45._8_4_;
      bVar8 = SUB81(uVar37 >> 3,0);
      auVar40._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar45._12_4_;
      auVar38 = vphaddd_avx(auVar40,auVar40);
      auVar38 = vphaddd_avx(auVar38,auVar38);
      vcvtdq2pd_avx(auVar38);
    }
    *(undefined8 *)(puVar30 + -0x58) = 0x107f70;
    printf("After average l first half: %lf\n");
    pLVar7 = pLVar21->summary;
    iVar14 = pLVar7->w * pLVar7->h;
    if (0 < iVar14) {
      uVar34 = (ulong)(iVar14 + 3U & 0xfffffffc);
      auVar43 = vpbroadcastq_avx512vl();
      uVar36 = 0;
      auVar9 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar38 = ZEXT816(0) << 0x40;
      do {
        auVar39 = auVar38;
        auVar44 = vpbroadcastq_avx512vl();
        auVar44 = vpor_avx2(auVar44,auVar9);
        uVar37 = vpcmpuq_avx512vl(auVar44,auVar43,2);
        uVar37 = uVar37 & 0xf;
        vmovdqu64_avx512vl(*(undefined1 (*) [32])(pLVar7->tbl + uVar36));
        auVar38 = vpgatherqd_avx512vl(*(undefined8 *)(uVar34 + 0x40));
        auVar41._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar38._4_4_;
        auVar41._0_4_ = (uint)((byte)uVar37 & 1) * auVar38._0_4_;
        auVar41._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar38._8_4_;
        auVar41._12_4_ = (uint)(byte)(uVar37 >> 3) * auVar38._12_4_;
        auVar38 = vpaddd_avx(auVar41,auVar39);
        uVar36 = uVar36 + 4;
      } while (uVar34 != uVar36);
      auVar38 = vmovdqa32_avx512vl(auVar38);
      bVar8 = (bool)((byte)uVar37 & 1);
      auVar42._0_4_ = (uint)bVar8 * auVar38._0_4_ | (uint)!bVar8 * auVar39._0_4_;
      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar8 * auVar38._4_4_ | (uint)!bVar8 * auVar39._4_4_;
      bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar8 * auVar38._8_4_ | (uint)!bVar8 * auVar39._8_4_;
      bVar8 = SUB81(uVar37 >> 3,0);
      auVar42._12_4_ = (uint)bVar8 * auVar38._12_4_ | (uint)!bVar8 * auVar39._12_4_;
      auVar38 = vphaddd_avx(auVar42,auVar42);
      auVar38 = vphaddd_avx(auVar38,auVar38);
      vcvtdq2pd_avx(auVar38);
    }
    *(undefined8 *)(puVar30 + -0x58) = 0x108010;
    printf("After average l second half: %lf\n");
    pauVar25 = local_b0;
    for (pauVar29 = _record_count; pauVar29 != pauVar25;
        pauVar29 = (undefined1 (*) [16])(*pauVar29 + 8)) {
      uVar4 = *(undefined8 *)(**(long **)*pauVar29 + -0x18);
      cVar10 = (char)*(long **)*pauVar29;
      *(undefined8 *)(puVar30 + -0x58) = 0x10803b;
      std::ios::widen((char)uVar4 + cVar10);
      *(undefined8 *)(puVar30 + -0x58) = 0x108046;
      std::ostream::put(cVar10);
      *(undefined8 *)(puVar30 + -0x58) = 0x10804e;
      std::ostream::flush();
    }
    local_340._M_h = local_f8;
    *(undefined8 *)((long)&local_340._M_h + *(long *)(local_f8 + -0x18)) = local_f0;
    *(undefined8 *)(puVar30 + -0x58) = 0x108081;
    std::filebuf::~filebuf((filebuf *)&out);
    *(undefined8 *)(puVar30 + -0x58) = 0x10808d;
    std::ios_base::~ios_base(local_248);
    puVar30 = local_108;
    *(undefined8 *)(local_108 + -8) = 0x10809d;
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_88);
    psVar1 = local_e0;
    iVar14 = local_9c + 1;
    if (iVar14 == 5) {
      if (local_e0 != &file._M_string_length) {
        *(undefined8 *)(puVar30 + -8) = 0x1080d3;
        operator_delete(psVar1,file._M_string_length + 1);
      }
      pauVar25 = _record_count;
      if (_record_count != (undefined1 (*) [16])0x0) {
        uVar34 = (long)local_a8 - (long)_record_count;
        *(undefined8 *)(puVar30 + -8) = 0x1080ee;
        operator_delete(pauVar25,uVar34);
      }
      return;
    }
  } while( true );
}

Assistant:

void HeavyChange_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(3);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 8 * HeavyChange_BLOCK + 2 * HeavyChange_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 10;
		auto mp = HashMap<DATA_LEN>();
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[1] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[2] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[3] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[4] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[5] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[6] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[7] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[8] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[9] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM / 2; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		int record_count;
		auto records =
			read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &record_count);
		Data<DATA_LEN> packet;
		int t;
		int num = 0;
		int slot_packets = std::min(record_count / 2, MAX_PACKET);
		while (num < slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = 1;
			else
				mp[packet] += 1;
			num++;

			for (int j = 0; j < SKETCH_NUM / 2; ++j) {
				sketch[j]->Init(packet);
			}
		}

		while (num < 2 * slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = -1;
			else
				mp[packet] -= 1;
			num++;

			for (int j = SKETCH_NUM / 2; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet);
			}
		}

		free(records);

		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			sketch[j]->Check(mp, sketch[j + (SKETCH_NUM / 2)], outs);
		}

		ofstream out;
		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		printf("After average l first half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		printf("After average l second half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}